

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O3

void __thiscall ThreadParser::ThreadParser(ThreadParser *this)

{
  SAXParser **ppSVar1;
  _func_int *p_Var2;
  XMLGrammarPool *pXVar3;
  XercesDOMParser *this_00;
  SAXParser *pSVar4;
  SAX2XMLReader *pSVar5;
  undefined8 *puVar6;
  SAXHandler *pSVar7;
  _func_int **pp_Var8;
  SAX2Handler *pSVar9;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar10;
  ulong in_RSI;
  
  *(undefined8 *)((long)&this->fSAX2Handler + 4) = 0;
  *(undefined8 *)((long)&this->fDOMErrorHandler + 4) = 0;
  this->fSAXHandler = (SAXHandler *)0x0;
  this->fSAX2Handler = (SAX2Handler *)0x0;
  this->fSAXParser = (SAXParser *)0x0;
  this->fSAX2Parser = (SAX2XMLReader *)0x0;
  this->fXercesDOMParser = (XercesDOMParser *)0x0;
  this->fDoc = (DOMDocument *)0x0;
  pXVar3 = gp;
  if (gRunInfo.dom == true) {
    this_00 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,in_RSI);
    if (pXVar3 == (XMLGrammarPool *)0x0) {
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (this_00,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      this->fXercesDOMParser = this_00;
    }
    else {
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (this_00,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,gp);
      this->fXercesDOMParser = this_00;
      xercesc_4_0::XercesDOMParser::cacheGrammarFromParse(SUB81(this_00,0));
      xercesc_4_0::XercesDOMParser::useCachedGrammarInParse(SUB81(this->fXercesDOMParser,0));
    }
    xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this->fXercesDOMParser);
    xercesc_4_0::AbstractDOMParser::setDoSchema(SUB81(this->fXercesDOMParser,0));
    xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(SUB81(this->fXercesDOMParser,0));
    xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(SUB81(this->fXercesDOMParser,0))
    ;
    xercesc_4_0::AbstractDOMParser::setDoNamespaces(SUB81(this->fXercesDOMParser,0));
    puVar6 = (undefined8 *)operator_new(0x20);
    *puVar6 = &PTR__HandlerBase_0010a610;
    puVar6[1] = &PTR__HandlerBase_0010a6b8;
    puVar6[2] = &PTR__HandlerBase_0010a6f0;
    puVar6[3] = &PTR__HandlerBase_0010a758;
    this->fDOMErrorHandler = (ErrorHandler *)(puVar6 + 3);
    xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this->fXercesDOMParser);
    return;
  }
  if (gRunInfo.sax == true) {
    ppSVar1 = &this->fSAXParser;
    pSVar4 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,in_RSI);
    if (pXVar3 == (XMLGrammarPool *)0x0) {
      xercesc_4_0::SAXParser::SAXParser
                (pSVar4,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      *ppSVar1 = pSVar4;
    }
    else {
      xercesc_4_0::SAXParser::SAXParser
                (pSVar4,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,gp);
      *ppSVar1 = pSVar4;
      xercesc_4_0::SAXParser::cacheGrammarFromParse(SUB81(pSVar4,0));
      xercesc_4_0::SAXParser::useCachedGrammarInParse(SUB81(*ppSVar1,0));
      pSVar4 = *ppSVar1;
    }
    xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)pSVar4);
    xercesc_4_0::SAXParser::setDoSchema(SUB81(this->fSAXParser,0));
    xercesc_4_0::SAXParser::setHandleMultipleImports(SUB81(this->fSAXParser,0));
    xercesc_4_0::SAXParser::setValidationSchemaFullChecking(SUB81(this->fSAXParser,0));
    xercesc_4_0::SAXParser::setDoNamespaces(SUB81(this->fSAXParser,0));
    pSVar7 = (SAXHandler *)operator_new(0x28);
    (pSVar7->super_HandlerBase).super_EntityResolver._vptr_EntityResolver =
         (_func_int **)&PTR__HandlerBase_0010a8d8;
    (pSVar7->super_HandlerBase).super_DTDHandler._vptr_DTDHandler =
         (_func_int **)&PTR__SAXHandler_0010a980;
    (pSVar7->super_HandlerBase).super_DocumentHandler._vptr_DocumentHandler =
         (_func_int **)&PTR__SAXHandler_0010a9b8;
    (pSVar7->super_HandlerBase).super_ErrorHandler._vptr_ErrorHandler =
         (_func_int **)&PTR__SAXHandler_0010aa20;
    this->fSAXHandler = pSVar7;
    pSVar7->SAXInstance = this;
    (**(code **)(*(long *)this->fSAXParser + 0x20))
              (this->fSAXParser,&(pSVar7->super_HandlerBase).super_DocumentHandler);
    pSVar9 = (SAX2Handler *)this->fSAXHandler;
    pSVar4 = this->fSAXParser;
    if (pSVar9 != (SAX2Handler *)0x0) {
      pSVar9 = (SAX2Handler *)&(pSVar9->super_DefaultHandler).super_ErrorHandler;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pSVar4 + 0x28);
    goto LAB_00104cc3;
  }
  if (gp == (XMLGrammarPool *)0x0) {
    pSVar5 = (SAX2XMLReader *)
             xercesc_4_0::XMLReaderFactory::createXMLReader
                       (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
    this->fSAX2Parser = pSVar5;
  }
  else {
    pSVar5 = (SAX2XMLReader *)xercesc_4_0::XMLReaderFactory::createXMLReader(gpMemMgr,gp);
    this->fSAX2Parser = pSVar5;
    (*pSVar5->_vptr_SAX2XMLReader[0xc])
              (pSVar5,&xercesc_4_0::XMLUni::fgXercesCacheGrammarFromParse,1);
    (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
              (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesUseCachedGrammarInParse,1);
    pSVar5 = this->fSAX2Parser;
  }
  (*pSVar5->_vptr_SAX2XMLReader[0xc])
            (pSVar5,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,(ulong)gRunInfo.doNamespaces);
  (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
            (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesSchema,(ulong)gRunInfo.doSchema);
  (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
            (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
  (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
            (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,
             (ulong)gRunInfo.schemaFullChecking);
  pSVar5 = this->fSAX2Parser;
  p_Var2 = pSVar5->_vptr_SAX2XMLReader[0xc];
  if (gRunInfo.valScheme == Val_Auto) {
    (*p_Var2)(pSVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
    pSVar5 = this->fSAX2Parser;
    pp_Var8 = pSVar5->_vptr_SAX2XMLReader;
    uVar10 = 1;
LAB_00104c2d:
    (*pp_Var8[0xc])(pSVar5,&xercesc_4_0::XMLUni::fgXercesDynamic,uVar10);
  }
  else {
    if (gRunInfo.valScheme != Val_Never) {
      (*p_Var2)(pSVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
      pSVar5 = this->fSAX2Parser;
      pp_Var8 = pSVar5->_vptr_SAX2XMLReader;
      uVar10 = 0;
      goto LAB_00104c2d;
    }
    (*p_Var2)(pSVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
  }
  (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
            (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,
             (ulong)gRunInfo.doNamespacePrefixes);
  pSVar9 = (SAX2Handler *)operator_new(0x38);
  (pSVar9->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver =
       (_func_int **)&PTR__DefaultHandler_0010aa78;
  (pSVar9->super_DefaultHandler).super_DTDHandler._vptr_DTDHandler =
       (_func_int **)&PTR__SAX2Handler_0010ab90;
  (pSVar9->super_DefaultHandler).super_ContentHandler._vptr_ContentHandler =
       (_func_int **)&PTR__SAX2Handler_0010abc8;
  (pSVar9->super_DefaultHandler).super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__SAX2Handler_0010ac40;
  (pSVar9->super_DefaultHandler).super_LexicalHandler._vptr_LexicalHandler =
       (_func_int **)&PTR__SAX2Handler_0010ac80;
  (pSVar9->super_DefaultHandler).super_DeclHandler._vptr_DeclHandler =
       (_func_int **)&PTR__SAX2Handler_0010acd8;
  this->fSAX2Handler = pSVar9;
  pSVar9->SAX2Instance = this;
  (*this->fSAX2Parser->_vptr_SAX2XMLReader[8])
            (this->fSAX2Parser,&(pSVar9->super_DefaultHandler).super_ContentHandler);
  pSVar9 = this->fSAX2Handler;
  pSVar4 = (SAXParser *)this->fSAX2Parser;
  if (pSVar9 != (SAX2Handler *)0x0) {
    pSVar9 = (SAX2Handler *)&(pSVar9->super_DefaultHandler).super_ErrorHandler;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pSVar4 + 0x58);
LAB_00104cc3:
  (*UNRECOVERED_JUMPTABLE)(pSVar4,pSVar9);
  return;
}

Assistant:

ThreadParser::ThreadParser()
{
    fSAXParser       = 0;
    fSAX2Parser      = 0;
    fXercesDOMParser = 0;
    fSAXHandler      = 0;
    fSAX2Handler     = 0;
    fDOMErrorHandler = 0;
    fDoc             = 0;
    fCheckSum        = 0;

    if (gRunInfo.dom) {
        // Set up to use a DOM parser
        /** Grammar caching thread testing */
        if (gp) {
            fXercesDOMParser = new XercesDOMParser(0, XMLPlatformUtils::fgMemoryManager, gp);
            fXercesDOMParser->cacheGrammarFromParse(true);
            fXercesDOMParser->useCachedGrammarInParse(true);
        }
        else {
            fXercesDOMParser = new XercesDOMParser;
        }
        switch (gRunInfo.valScheme) {
            case SAXParser::Val_Never:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Never);
                break;
            case SAXParser::Val_Auto:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Auto);
                break;
            default: //SAXParser::Val_Always:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Always);
                break;
        }
        fXercesDOMParser->setDoSchema(gRunInfo.doSchema);
        fXercesDOMParser->setHandleMultipleImports (true);
        fXercesDOMParser->setValidationSchemaFullChecking(gRunInfo.schemaFullChecking);
        fXercesDOMParser->setDoNamespaces(gRunInfo.doNamespaces);
        fDOMErrorHandler = (ErrorHandler*) new HandlerBase();
        fXercesDOMParser->setErrorHandler(fDOMErrorHandler);
    }

    else if (gRunInfo.sax) {
        // Set up to use a SAX1 parser.
        /** Grammar caching thread testing */
        if (gp) {
            fSAXParser = new SAXParser(0, XMLPlatformUtils::fgMemoryManager, gp);
            fSAXParser->cacheGrammarFromParse(true);
            fSAXParser->useCachedGrammarInParse(true);
        }
        else {
            fSAXParser = new SAXParser();
        }
        fSAXParser->setValidationScheme(gRunInfo.valScheme);
        fSAXParser->setDoSchema(gRunInfo.doSchema);
        fSAXParser->setHandleMultipleImports (true);
        fSAXParser->setValidationSchemaFullChecking(gRunInfo.schemaFullChecking);
        fSAXParser->setDoNamespaces(gRunInfo.doNamespaces);
        fSAXHandler = new ThreadParser::SAXHandler();
        fSAXHandler->SAXInstance = this;
        fSAXParser->setDocumentHandler(fSAXHandler);
        fSAXParser->setErrorHandler(fSAXHandler);
    }

    else {
        // Set up to use a SAX2 parser.
        /** Grammar caching thread testing */
        if (gp) {
            fSAX2Parser = XMLReaderFactory::createXMLReader(gpMemMgr, gp);
            fSAX2Parser->setFeature(XMLUni::fgXercesCacheGrammarFromParse,true);
            fSAX2Parser->setFeature(XMLUni::fgXercesUseCachedGrammarInParse,true);
        }
        else {
            fSAX2Parser = XMLReaderFactory::createXMLReader();
        }

        fSAX2Parser->setFeature(XMLUni::fgSAX2CoreNameSpaces,(gRunInfo.doNamespaces));
        fSAX2Parser->setFeature(XMLUni::fgXercesSchema,(gRunInfo.doSchema));
        fSAX2Parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        fSAX2Parser->setFeature(XMLUni::fgXercesSchemaFullChecking,(gRunInfo.schemaFullChecking));

        switch (gRunInfo.valScheme) {
            case SAXParser::Val_Never:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, false);
                break;
            case SAXParser::Val_Auto:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
                fSAX2Parser->setFeature(XMLUni::fgXercesDynamic, true);
                break;
            default: //SAXParser::Val_Always:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
                fSAX2Parser->setFeature(XMLUni::fgXercesDynamic, false);
                break;
        }

        fSAX2Parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes,(gRunInfo.doNamespacePrefixes));
        fSAX2Handler = new ThreadParser::SAX2Handler();
        fSAX2Handler->SAX2Instance = this;
        fSAX2Parser->setContentHandler(fSAX2Handler);
        fSAX2Parser->setErrorHandler(fSAX2Handler);
    }
}